

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O0

bool StringEq(string *a,string *b,char *filename,int lineno,char *namea,char *nameb)

{
  undefined8 uVar1;
  bool bVar2;
  char *nameb_local;
  char *namea_local;
  int lineno_local;
  char *filename_local;
  string *b_local;
  string *a_local;
  
  bVar2 = std::operator!=(a,b);
  if (bVar2) {
    printf("%s: %d: ASSERT FAILED: %s == %s:\n",filename,(ulong)(uint)lineno,namea,nameb);
    uVar1 = std::__cxx11::string::c_str();
    printf("EXPECTED:\n%s\n",uVar1);
    uVar1 = std::__cxx11::string::c_str();
    printf("ACTUAL:\n%s\n",uVar1);
  }
  a_local._7_1_ = !bVar2;
  return a_local._7_1_;
}

Assistant:

bool StringEq(const string& a, const string& b,
                    const char* filename, int lineno,
                    const char* namea, const char* nameb) {
  if (a != b) {
    printf("%s: %d: ASSERT FAILED: %s == %s:\n", filename, lineno,
           namea, nameb);
    printf("EXPECTED:\n%s\n", a.c_str());
    printf("ACTUAL:\n%s\n", b.c_str());
    return false;
  }
  return true;
}